

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationrootelements.cpp
# Opt level: O2

uint32_t __thiscall
icu_63::CollationRootElements::getSecondaryAfter
          (CollationRootElements *this,int32_t index,uint32_t s)

{
  uint uVar1;
  uint32_t *puVar2;
  uint uVar3;
  ulong uVar4;
  uint32_t uVar5;
  long lVar6;
  uint *puVar7;
  
  puVar2 = this->elements;
  if (index == 0) {
    lVar6 = (long)(int)puVar2[1];
    uVar4 = (ulong)puVar2[lVar6];
    uVar5 = 0x10000;
  }
  else {
    lVar6 = (long)index;
    uVar1 = puVar2[lVar6 + 1];
    uVar3 = uVar1;
    if (0x50004ff < uVar1) {
      uVar3 = 0x5000500;
    }
    uVar4 = (ulong)uVar3;
    if (-1 < (char)uVar1) {
      uVar4 = 0x5000500;
    }
    uVar5 = (uint)*(byte *)((long)puVar2 + 0x12) << 8;
  }
  puVar7 = puVar2 + lVar6;
  do {
    puVar7 = puVar7 + 1;
    uVar1 = (uint)(uVar4 >> 0x10);
    if (s < uVar1) {
      return uVar1;
    }
    uVar4 = (ulong)*puVar7;
  } while ((char)*puVar7 < '\0');
  return uVar5;
}

Assistant:

uint32_t
CollationRootElements::getSecondaryAfter(int32_t index, uint32_t s) const {
    uint32_t secTer;
    uint32_t secLimit;
    if(index == 0) {
        // primary = 0
        U_ASSERT(s != 0);
        index = (int32_t)elements[IX_FIRST_SECONDARY_INDEX];
        secTer = elements[index];
        // Gap at the end of the secondary CE range.
        secLimit = 0x10000;
    } else {
        U_ASSERT(index >= (int32_t)elements[IX_FIRST_PRIMARY_INDEX]);
        secTer = getFirstSecTerForPrimary(index + 1);
        // If this is an explicit sec/ter unit, then it will be read once more.
        // Gap for secondaries of primary CEs.
        secLimit = getSecondaryBoundary();
    }
    for(;;) {
        uint32_t sec = secTer >> 16;
        if(sec > s) { return sec; }
        secTer = elements[++index];
        if((secTer & SEC_TER_DELTA_FLAG) == 0) { return secLimit; }
    }
}